

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall
QtPrivate::QPodArrayOps<unsigned_int>::reallocate
          (QPodArrayOps<unsigned_int> *this,qsizetype alloc,AllocationOption option)

{
  long lVar1;
  AllocationOption in_EDX;
  qsizetype in_RSI;
  uint *in_RDI;
  long in_FS_OFFSET;
  pair<QTypedArrayData<unsigned_int>_*,_unsigned_int_*> pVar2;
  pair<QTypedArrayData<unsigned_int>_*,_unsigned_int_*> pair;
  uint *local_10;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pVar2 = QTypedArrayData<unsigned_int>::reallocateUnaligned
                    ((QTypedArrayData<unsigned_int> *)&DAT_aaaaaaaaaaaaaaaa,in_RDI,in_RSI,in_EDX);
  local_10 = pVar2.second;
  if (local_10 == (uint *)0x0) {
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      qBadAlloc();
    }
  }
  else {
    *(QTypedArrayData<unsigned_int> **)in_RDI = pVar2.first;
    *(uint **)(in_RDI + 2) = local_10;
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      return;
    }
  }
  __stack_chk_fail();
}

Assistant:

void reallocate(qsizetype alloc, QArrayData::AllocationOption option)
    {
        auto pair = Data::reallocateUnaligned(this->d, this->ptr, alloc, option);
        Q_CHECK_PTR(pair.second);
        Q_ASSERT(pair.first != nullptr);
        this->d = pair.first;
        this->ptr = pair.second;
    }